

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sequential_attribute_decoder.cc
# Opt level: O2

bool __thiscall
draco::SequentialAttributeDecoder::InitPredictionScheme
          (SequentialAttributeDecoder *this,PredictionSchemeInterface *ps)

{
  PointCloud *this_00;
  PointCloudDecoder *this_01;
  char cVar1;
  int iVar2;
  Type type;
  int32_t parent_att_id;
  PointAttribute *pPVar4;
  int i;
  uint uVar5;
  int iVar3;
  
  uVar5 = 0;
  while( true ) {
    iVar2 = (*ps->_vptr_PredictionSchemeInterface[5])(ps);
    if (iVar2 <= (int)uVar5) break;
    this_00 = this->decoder_->point_cloud_;
    type = (*ps->_vptr_PredictionSchemeInterface[6])(ps,(ulong)uVar5);
    parent_att_id = PointCloud::GetNamedAttributeId(this_00,type);
    if (parent_att_id == -1) break;
    this_01 = this->decoder_;
    if (this_01->version_major_ < 2) {
      iVar3 = (*ps->_vptr_PredictionSchemeInterface[7])
                        (ps,(_Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
                             )(this_01->point_cloud_->attributes_).
                              super__Vector_base<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[parent_att_id]._M_t.
                              super___uniq_ptr_impl<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>
                              ._M_t);
      cVar1 = (char)iVar3;
    }
    else {
      pPVar4 = PointCloudDecoder::GetPortableAttribute(this_01,parent_att_id);
      if (pPVar4 == (PointAttribute *)0x0) break;
      iVar3 = (*ps->_vptr_PredictionSchemeInterface[7])(ps,pPVar4);
      cVar1 = (char)iVar3;
    }
    if (cVar1 == '\0') break;
    uVar5 = uVar5 + 1;
  }
  return iVar2 <= (int)uVar5;
}

Assistant:

bool SequentialAttributeDecoder::InitPredictionScheme(
    PredictionSchemeInterface *ps) {
  for (int i = 0; i < ps->GetNumParentAttributes(); ++i) {
    const int att_id = decoder_->point_cloud()->GetNamedAttributeId(
        ps->GetParentAttributeType(i));
    if (att_id == -1) {
      return false;  // Requested attribute does not exist.
    }
#ifdef DRACO_BACKWARDS_COMPATIBILITY_SUPPORTED
    if (decoder_->bitstream_version() < DRACO_BITSTREAM_VERSION(2, 0)) {
      if (!ps->SetParentAttribute(decoder_->point_cloud()->attribute(att_id))) {
        return false;
      }
    } else
#endif
    {
      const PointAttribute *const pa = decoder_->GetPortableAttribute(att_id);
      if (pa == nullptr || !ps->SetParentAttribute(pa)) {
        return false;
      }
    }
  }
  return true;
}